

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_memcmp.c
# Opt level: O3

int main2(void)

{
  return 0;
}

Assistant:

int main2() {
    const char a[] = "aaaaa";
    const char c[] = "ccccc";
    ASSERT_INT_EQ(memcmp(a, a, sizeof(a)), 0);
    ASSERT_INT_LT(memcmp(a, c, sizeof(a)), 0);
    ASSERT_INT_GT(memcmp(c, a, sizeof(a)), 0);
    return 0;
}